

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::EndObject(ProtoWriter *this)

{
  ProtoElement *pPVar1;
  ProtoElement *pPVar2;
  
  if (this->invalid_depth_ < 1) {
    pPVar1 = (this->element_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
             ._M_head_impl;
    if (pPVar1 != (ProtoElement *)0x0) {
      pPVar2 = ProtoElement::pop(pPVar1);
      pPVar1 = (this->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      (this->element_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>.
      _M_head_impl = pPVar2;
      if (pPVar1 != (ProtoElement *)0x0) {
        (**(code **)((long)(pPVar1->super_BaseElement)._vptr_BaseElement + 8))();
        pPVar2 = (this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl;
      }
      if (pPVar2 != (ProtoElement *)0x0) {
        return this;
      }
    }
    WriteRootMessage(this);
  }
  else {
    this->invalid_depth_ = this->invalid_depth_ + -1;
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::EndObject() {
  if (invalid_depth_ > 0) {
    --invalid_depth_;
    return this;
  }

  if (element_ != nullptr) {
    element_.reset(element_->pop());
  }


  // If ending the root element,
  // then serialize the full message with calculated sizes.
  if (element_ == nullptr) {
    WriteRootMessage();
  }
  return this;
}